

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError PaAlsa_GetStreamOutputCard(PaStream *s,int *card)

{
  snd_pcm_t *psVar1;
  long lVar2;
  int iVar3;
  size_t __n;
  undefined1 *__s;
  undefined *puStack_40;
  undefined1 auStack_38 [8];
  PaAlsaStream *local_30;
  PaAlsaStream *stream;
  
  puStack_40 = (undefined *)0x10ff44;
  GetAlsaStreamPointer(s,&local_30);
  paUtilErr_ = 0;
  if ((local_30->playback).pcm == (snd_pcm_t *)0x0) {
    puStack_40 = &UNK_0010ffc4;
    PaUtil_DebugPrint(
                     "Expression \'stream->playback.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4749\n"
                     );
  }
  puStack_40 = (undefined *)0x10ff61;
  __n = snd_pcm_info_sizeof();
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_38 + lVar2;
  *(undefined8 *)(auStack_38 + lVar2 + -8) = 0x10ff82;
  memset(__s,0,__n);
  psVar1 = (local_30->playback).pcm;
  *(undefined8 *)(auStack_38 + lVar2 + -8) = 0x10ff92;
  paUtilErr_ = snd_pcm_info(psVar1,__s);
  if (-1 < paUtilErr_) {
    *(undefined8 *)(auStack_38 + lVar2 + -8) = 0x10ffa4;
    iVar3 = snd_pcm_info_get_card(__s);
    *card = iVar3;
    return 0;
  }
  *(undefined **)(auStack_38 + lVar2 + -8) = &UNK_0010ffda;
  PaUtil_DebugPrint(
                   "Expression \'alsa_snd_pcm_info( stream->playback.pcm, pcmInfo )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4752\n"
                   );
}

Assistant:

PaError PaAlsa_GetStreamOutputCard( PaStream* s, int* card )
{
    PaAlsaStream *stream;
    PaError result = paNoError;
    snd_pcm_info_t* pcmInfo;

    PA_ENSURE( GetAlsaStreamPointer( s, &stream ) );

    /* XXX: More descriptive error? */
    PA_UNLESS( stream->playback.pcm, paDeviceUnavailable );

    alsa_snd_pcm_info_alloca( &pcmInfo );
    PA_ENSURE( alsa_snd_pcm_info( stream->playback.pcm, pcmInfo ) );
    *card = alsa_snd_pcm_info_get_card( pcmInfo );

error:
    return result;
}